

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall Parser::doExec(Parser *this)

{
  bool bVar1;
  uint uVar2;
  perms pVar3;
  reference __str;
  size_type sVar4;
  ostream *poVar5;
  char *command;
  byte local_1cb;
  byte local_1a9;
  path local_180;
  undefined8 local_158;
  perms local_150;
  byte local_149;
  perms permissions;
  path local_120;
  path local_f8;
  byte local_c9;
  path local_c8;
  path local_a0;
  undefined4 local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 local_50 [8];
  string executable;
  string *exec;
  iterator __end1;
  iterator __begin1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Parser *this_local;
  
  __end1 = std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->toLaunch);
  exec = (string *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->toLaunch);
  while (bVar1 = std::__detail::operator==
                           (&__end1.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&exec), ((bVar1 ^ 0xffU) & 1) != 0) {
    executable.field_2._8_8_ =
         std::__detail::
         _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
         ::operator*(&__end1);
    stringSplit(&local_68,(string *)executable.field_2._8_8_,' ');
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_68,0);
    std::__cxx11::string::string((string *)local_50,__str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    sVar4 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->disabled,(key_type *)local_50);
    if (sVar4 == 0) {
      local_c9 = 0;
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 auto_format);
      uVar2 = std::filesystem::__cxx11::path::has_parent_path();
      local_1a9 = 0;
      if ((uVar2 & 1) != 0) {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   auto_format);
        local_c9 = 1;
        bVar1 = std::filesystem::exists(&local_c8);
        local_1a9 = bVar1 ^ 0xff;
      }
      if ((local_c9 & 1) != 0) {
        std::filesystem::__cxx11::path::~path(&local_c8);
      }
      std::filesystem::__cxx11::path::~path(&local_a0);
      if ((local_1a9 & 1) == 0) {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   auto_format);
        bVar1 = std::filesystem::exists(&local_f8);
        std::filesystem::__cxx11::path::~path(&local_f8);
        if (bVar1) {
          local_149 = 0;
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     auto_format);
          bVar1 = std::filesystem::is_regular_file(&local_120);
          local_1cb = 0;
          if (!bVar1) {
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      ((path *)&permissions,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,auto_format);
            local_149 = 1;
            bVar1 = std::filesystem::is_symlink((path *)&permissions);
            local_1cb = bVar1 ^ 0xff;
          }
          if ((local_149 & 1) != 0) {
            std::filesystem::__cxx11::path::~path((path *)&permissions);
          }
          std::filesystem::__cxx11::path::~path(&local_120);
          if ((local_1cb & 1) != 0) {
            poVar5 = std::operator<<((ostream *)&std::cerr," ! ");
            poVar5 = std::operator<<(poVar5,(string *)local_50);
            poVar5 = std::operator<<(poVar5," not a file");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     auto_format);
          local_158 = std::filesystem::status(&local_180);
          pVar3 = std::filesystem::file_status::permissions((file_status *)&local_158);
          std::filesystem::__cxx11::path::~path(&local_180);
          local_150 = pVar3;
          pVar3 = std::filesystem::operator&(pVar3,owner_exec|group_exec|others_exec);
          if (pVar3 == none) {
            poVar5 = std::operator<<((ostream *)&std::cerr," ! ");
            poVar5 = std::operator<<(poVar5,(string *)local_50);
            poVar5 = std::operator<<(poVar5," is not executable");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
        }
        command = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        executable.field_2._8_8_);
        launch(command);
        local_78 = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr," ! ");
        poVar5 = std::operator<<(poVar5,(string *)local_50);
        poVar5 = std::operator<<(poVar5," does not exist, ignoring");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_78 = 3;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout," - Skipping disabled ");
      poVar5 = std::operator<<(poVar5,(string *)executable.field_2._8_8_);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_78 = 3;
    }
    std::__cxx11::string::~string((string *)local_50);
    std::__detail::
    _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void doExec() {
        for (const std::string &exec : toLaunch) {
            const std::string executable = stringSplit(exec)[0];
            if (disabled.count(executable)) {
                std::cout << " - Skipping disabled " << exec << std::endl;
                continue;
            }
            if (fs::path(executable).has_parent_path() && !fs::exists(executable)) {
                std::cerr << " ! " << executable << " does not exist, ignoring" << std::endl;
                continue;
            }
            if (fs::exists(executable)) {
                if (!fs::is_regular_file(executable) &&
                    !fs::is_symlink(executable)) {
                    std::cerr << " ! " << executable << " not a file" << std::endl;
                }
                fs::perms permissions = fs::status(executable).permissions();
                if ((permissions & execPermissions) == fs::perms::none) {
                    std::cerr << " ! " << executable << " is not executable" << std::endl;
                }

            }

            launch(exec.c_str());
        }
    }